

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

void __thiscall CCNR::ls_solver::ls_solver(ls_solver *this)

{
  (this->_inst_file)._M_dataplus._M_p = (pointer)&(this->_inst_file).field_2;
  (this->_inst_file)._M_string_length = 0;
  (this->_inst_file).field_2._M_local_buf[0] = '\0';
  (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_num_vars = 0;
  this->_num_clauses = 0;
  memset(&this->_unsat_clauses,0,0xc0);
  Mersenne::Mersenne(&this->_random_gen);
  this->_aspiration_score = 0;
  this->_swt_threshold = 0x32;
  this->_avg_clause_weight = 0;
  this->_delta_total_clause_weight = 0;
  this->_init_unsat_nums = 0;
  this->_prob_p = 0.001;
  (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->_additional_len = 10;
  this->_max_tries = 1;
  this->_max_steps = 900000000;
  this->_max_mems = 100000000;
  this->_random_seed = 1;
  this->_swt_p = 0.3;
  this->_swt_q = 0.7;
  this->_aspiration_active = true;
  this->_mems = 0;
  return;
}

Assistant:

ls_solver::ls_solver()
  : _num_vars(0)
  , _num_clauses(0)
  , _best_found_cost(0)
  , _best_cost_time(0)
  , _step(0)
  , _aspiration_score(0)
  , _avg_clause_weight(0)
  , _delta_total_clause_weight(0)
  , _init_unsat_nums(0)
{
    _additional_len = 10;
    _max_tries = 1;                 // 100
    _max_steps = 900 * 1000 * 1000; // 2 0000 0000
    _max_mems = 100 * 1000 * 1000;
    _random_seed = 1;
    // _time_limit = 3000;
    _swt_threshold = 50;
    _swt_p = 0.3;
    _swt_q = 0.7;
    _aspiration_active = true;
    _mems = 0;
    _prob_p = 0.001;
}